

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

void __thiscall glslang::TFunction::~TFunction(TFunction *this)

{
  pointer pTVar1;
  
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_0093b168;
  pTVar1 = (this->parameters).
           super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
           super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (this->parameters).
                super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
                super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pTVar1->type != (TType *)0x0) {
        (*pTVar1->type->_vptr_TType[1])();
      }
      pTVar1 = pTVar1 + 1;
    } while (pTVar1 != (this->parameters).
                       super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                       .
                       super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

TFunction::~TFunction()
{
    for (TParamList::iterator i = parameters.begin(); i != parameters.end(); ++i)
        delete (*i).type;
}